

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O0

void __thiscall
BanMan::Ban(BanMan *this,CNetAddr *net_addr,int64_t ban_time_offset,bool since_unix_epoch)

{
  long lVar1;
  undefined1 in_CL;
  CSubNet *in_RDX;
  undefined8 in_RDI;
  undefined1 since_unix_epoch_00;
  long in_FS_OFFSET;
  CSubNet sub_net;
  CSubNet *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffffa0;
  int64_t in_stack_ffffffffffffffc0;
  CSubNet *in_stack_ffffffffffffffc8;
  BanMan *in_stack_ffffffffffffffd0;
  
  since_unix_epoch_00 = (undefined1)((ulong)in_RDI >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CSubNet::CSubNet(in_RDX,(CNetAddr *)
                          (CONCAT17(in_CL,in_stack_ffffffffffffffa0) & 0x1ffffffffffffff));
  Ban(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
      (bool)since_unix_epoch_00);
  CSubNet::~CSubNet(in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BanMan::Ban(const CNetAddr& net_addr, int64_t ban_time_offset, bool since_unix_epoch)
{
    CSubNet sub_net(net_addr);
    Ban(sub_net, ban_time_offset, since_unix_epoch);
}